

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DLightFlash::Tick(DLightFlash *this)

{
  int iVar1;
  uint uVar2;
  DLightFlash *this_local;
  
  iVar1 = this->m_Count + -1;
  this->m_Count = iVar1;
  if (iVar1 == 0) {
    if ((int)((this->super_DLighting).super_DSectorEffect.m_Sector)->lightlevel == this->m_MaxLight)
    {
      sector_t::SetLightLevel
                ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,this->m_MinLight);
      uVar2 = FRandom::operator()(&pr_lightflash);
      this->m_Count = (uVar2 & this->m_MinTime) + 1;
    }
    else {
      sector_t::SetLightLevel
                ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,this->m_MaxLight);
      uVar2 = FRandom::operator()(&pr_lightflash);
      this->m_Count = (uVar2 & this->m_MaxTime) + 1;
    }
  }
  return;
}

Assistant:

void DLightFlash::Tick ()
{
	if (--m_Count == 0)
	{
		if (m_Sector->lightlevel == m_MaxLight)
		{
			m_Sector->SetLightLevel(m_MinLight);
			m_Count = (pr_lightflash() & m_MinTime) + 1;
		}
		else
		{
			m_Sector->SetLightLevel(m_MaxLight);
			m_Count = (pr_lightflash() & m_MaxTime) + 1;
		}
	}
}